

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

bool __thiscall tchecker::clockbounds::df_solver_t::solve(df_solver_t *this,local_lu_map_t *map)

{
  clock_id_t cVar1;
  bool bVar2;
  clock_id_t cVar3;
  loc_id_t lVar4;
  no_storage_array_t<int> nVar5;
  map_t *pmVar6;
  invalid_argument *this_00;
  ulong uVar7;
  loc_id_t lVar8;
  
  cVar1 = this->_clock_number;
  cVar3 = local_lu_map_t::clock_number(map);
  if (cVar1 == cVar3) {
    lVar8 = this->_loc_number;
    lVar4 = local_lu_map_t::loc_number(map);
    if (lVar8 == lVar4) {
      bVar2 = ensure_tight(this);
      if ((bVar2) && (this->_loc_number != 0)) {
        lVar8 = 0;
        do {
          if (this->_clock_number != 0) {
            uVar7 = 0;
            do {
              nVar5 = (no_storage_array_t<int>)L(this,lVar8,(clock_id_t)uVar7);
              pmVar6 = local_lu_map_t::L(map,lVar8);
              if ((pmVar6->super_array_capacity_t<unsigned_int>)._capacity <= uVar7) {
LAB_001c3723:
                __assert_fail("i < BASE::_capacity",
                              "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                              ,0xf1,
                              "T &tchecker::make_array_t<int, 4, tchecker::array_capacity_t<unsigned int>>::operator[](typename BASE::capacity_t) [T = int, T_ALLOCSIZE = 4, BASE = tchecker::array_capacity_t<unsigned int>]"
                             );
              }
              (&pmVar6->_fam)[uVar7] = nVar5;
              nVar5 = (no_storage_array_t<int>)U(this,lVar8,(clock_id_t)uVar7);
              pmVar6 = local_lu_map_t::U(map,lVar8);
              if ((pmVar6->super_array_capacity_t<unsigned_int>)._capacity <= uVar7)
              goto LAB_001c3723;
              (&pmVar6->_fam)[uVar7] = nVar5;
              uVar7 = uVar7 + 1;
            } while (uVar7 < this->_clock_number);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < this->_loc_number);
      }
      return bVar2;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"*** solve: invalid number of locations");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"*** solve: invalid number of clocks");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool df_solver_t::solve(tchecker::clockbounds::local_lu_map_t & map)
{
  if (_clock_number != map.clock_number())
    throw std::invalid_argument("*** solve: invalid number of clocks");
  if (_loc_number != map.loc_number())
    throw std::invalid_argument("*** solve: invalid number of locations");

  bool consistent = ensure_tight();
  if (!consistent)
    return false;

  for (tchecker::loc_id_t loc = 0; loc < _loc_number; ++loc)
    for (tchecker::clock_id_t clock = 0; clock < _clock_number; ++clock) {
      map.L(loc)[clock] = L(loc, clock);
      map.U(loc)[clock] = U(loc, clock);
    }

  return true;
}